

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_init__null(ma_context_config *pConfig,ma_context *pContext)

{
  ma_context *pContext_local;
  ma_context_config *pConfig_local;
  
  if (pContext != (ma_context *)0x0) {
    pContext->onUninit = ma_context_uninit__null;
    pContext->onDeviceIDEqual = ma_context_is_device_id_equal__null;
    pContext->onEnumDevices = ma_context_enumerate_devices__null;
    pContext->onGetDeviceInfo = ma_context_get_device_info__null;
    pContext->onDeviceInit = ma_device_init__null;
    pContext->onDeviceUninit = ma_device_uninit__null;
    pContext->onDeviceStart = (_func_ma_result_ma_device_ptr *)0x0;
    pContext->onDeviceStop = (_func_ma_result_ma_device_ptr *)0x0;
    pContext->onDeviceMainLoop = ma_device_main_loop__null;
    return 0;
  }
  __assert_fail("pContext != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x269d,"ma_result ma_context_init__null(const ma_context_config *, ma_context *)");
}

Assistant:

static ma_result ma_context_init__null(const ma_context_config* pConfig, ma_context* pContext)
{
    MA_ASSERT(pContext != NULL);

    (void)pConfig;

    pContext->onUninit         = ma_context_uninit__null;
    pContext->onDeviceIDEqual  = ma_context_is_device_id_equal__null;
    pContext->onEnumDevices    = ma_context_enumerate_devices__null;
    pContext->onGetDeviceInfo  = ma_context_get_device_info__null;
    pContext->onDeviceInit     = ma_device_init__null;
    pContext->onDeviceUninit   = ma_device_uninit__null;
    pContext->onDeviceStart    = NULL; /* Not required for synchronous backends. */
    pContext->onDeviceStop     = NULL; /* Not required for synchronous backends. */
    pContext->onDeviceMainLoop = ma_device_main_loop__null;

    /* The null backend always works. */
    return MA_SUCCESS;
}